

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O0

int lib::io::Stdin(State *state)

{
  UserData *this;
  UserData *user_data_00;
  State *in_RDI;
  Table *metatable;
  UserData *user_data;
  StackAPI api;
  StackAPI local_18;
  
  luna::StackAPI::StackAPI(&local_18,in_RDI);
  this = luna::State::NewUserData((State *)0x163a92);
  user_data_00 = (UserData *)luna::State::GetMetatable(state,(char *)api.stack_);
  luna::UserData::Set(this,_stdin,(Table *)user_data_00);
  luna::StackAPI::PushUserData((StackAPI *)this,user_data_00);
  return 1;
}

Assistant:

int Stdin(luna::State *state)
    {
        luna::StackAPI api(state);
        auto user_data = state->NewUserData();
        auto metatable = state->GetMetatable(METATABLE_FILE);
        user_data->Set(stdin, metatable);
        api.PushUserData(user_data);
        return 1;
    }